

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O1

void raviX_buffer_add_bytes(TextBuffer *mb,char *str,size_t len)

{
  size_t sVar1;
  char *pcVar2;
  size_t __n;
  
  raviX_buffer_resize(mb,len + mb->pos + 1);
  sVar1 = mb->capacity;
  __n = sVar1 - mb->pos;
  if (len < __n) {
    pcVar2 = mb->buf;
    strncpy(pcVar2 + mb->pos,str,__n);
    pcVar2[sVar1 - 1] = '\0';
    mb->pos = mb->pos + len;
    return;
  }
  __assert_fail("mb->capacity - mb->pos > len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/membuf.c"
                ,0x4f,"void raviX_buffer_add_bytes(TextBuffer *, const char *, size_t)");
}

Assistant:

void raviX_buffer_add_bytes(TextBuffer *mb, const char *str, size_t len)
{
	size_t required_size = mb->pos + len + 1; /* extra byte for NULL terminator */
	raviX_buffer_resize(mb, required_size);
	assert(mb->capacity - mb->pos > len);
	raviX_string_copy(&mb->buf[mb->pos], str, mb->capacity - mb->pos);
	mb->pos += len;
}